

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O2

PatternBlock * __thiscall PatternBlock::intersect(PatternBlock *this,PatternBlock *b)

{
  int iVar1;
  uintm uVar2;
  uintm uVar3;
  uintm uVar4;
  uintm uVar5;
  PatternBlock *pPVar6;
  int startbit;
  int iVar7;
  uintm resval;
  uintm resmask;
  PatternBlock *local_58;
  PatternBlock *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  PatternBlock *local_38;
  
  local_58 = this;
  if ((this->nonzerosize == -1) || (b->nonzerosize == -1)) {
    pPVar6 = (PatternBlock *)operator_new(0x38);
    PatternBlock(pPVar6,false);
  }
  else {
    pPVar6 = (PatternBlock *)operator_new(0x38);
    PatternBlock(pPVar6,true);
    iVar1 = local_58->nonzerosize + local_58->offset;
    iVar7 = b->nonzerosize + b->offset;
    if (iVar7 < iVar1) {
      iVar7 = iVar1;
    }
    pPVar6->offset = 0;
    local_40 = &pPVar6->maskvec;
    local_48 = &pPVar6->valvec;
    startbit = 0;
    local_50 = pPVar6;
    local_38 = b;
    for (iVar1 = 0; pPVar6 = local_58, iVar1 < iVar7; iVar1 = iVar1 + 4) {
      uVar2 = getMask(local_58,startbit,0x20);
      uVar3 = getValue(pPVar6,startbit,0x20);
      pPVar6 = local_38;
      uVar4 = getMask(local_38,startbit,0x20);
      uVar5 = getValue(pPVar6,startbit,0x20);
      if (((uVar5 ^ uVar3) & uVar2 & uVar4) != 0) {
        iVar7 = -1;
        break;
      }
      resmask = uVar4 | uVar2;
      resval = uVar3 & uVar2 | uVar5 & uVar4;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_40,&resmask);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_48,&resval);
      startbit = startbit + 0x20;
    }
    pPVar6 = local_50;
    local_50->nonzerosize = iVar7;
    normalize(local_50);
  }
  return pPVar6;
}

Assistant:

PatternBlock *PatternBlock::intersect(const PatternBlock *b) const

{ // Construct the intersecting pattern
  if (alwaysFalse() || b->alwaysFalse())
    return new PatternBlock(false);
  PatternBlock *res = new PatternBlock(true);
  int4 maxlength = (getLength() > b->getLength()) ? getLength() : b->getLength();

  res->offset = 0;
  int4 offset = 0;
  uintm mask1,val1,mask2,val2,commonmask;
  uintm resmask,resval;
  while(offset < maxlength) {
    mask1 = getMask(offset*8,sizeof(uintm)*8);
    val1 = getValue(offset*8,sizeof(uintm)*8);
    mask2 = b->getMask(offset*8,sizeof(uintm)*8);
    val2 = b->getValue(offset*8,sizeof(uintm)*8);
    commonmask = mask1 & mask2;	// Bits in mask shared by both patterns
    if ((commonmask & val1) != (commonmask & val2)) {
      res->nonzerosize = -1;	// Impossible pattern
      res->normalize();
      return res;
    }
    resmask = mask1 | mask2;
    resval = (mask1 & val1) | (mask2 & val2);
    res->maskvec.push_back(resmask);
    res->valvec.push_back(resval);
    offset += sizeof(uintm);
  }
  res->nonzerosize = maxlength;
  res->normalize();
  return res;
}